

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O0

int element6(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  ENCODING *enc_local;
  char *end_local;
  char *ptr_local;
  int tok_local;
  PROLOG_STATE *state_local;
  
  switch(tok) {
  case 0xf:
    state_local._4_4_ = 0x27;
    break;
  default:
    state_local._4_4_ = common(state,tok);
    break;
  case 0x12:
  case 0x29:
    state->handler = element7;
    state_local._4_4_ = 0x33;
    break;
  case 0x17:
    state->level = state->level + 1;
    state_local._4_4_ = 0x2c;
    break;
  case 0x1e:
    state->handler = element7;
    state_local._4_4_ = 0x35;
    break;
  case 0x1f:
    state->handler = element7;
    state_local._4_4_ = 0x34;
    break;
  case 0x20:
    state->handler = element7;
    state_local._4_4_ = 0x36;
  }
  return state_local._4_4_;
}

Assistant:

static int PTRCALL
element6(PROLOG_STATE *state, int tok, const char *ptr, const char *end,
         const ENCODING *enc) {
  UNUSED_P(ptr);
  UNUSED_P(end);
  UNUSED_P(enc);
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_ELEMENT_NONE;
  case XML_TOK_OPEN_PAREN:
    state->level += 1;
    return XML_ROLE_GROUP_OPEN;
  case XML_TOK_NAME:
  case XML_TOK_PREFIXED_NAME:
    state->handler = element7;
    return XML_ROLE_CONTENT_ELEMENT;
  case XML_TOK_NAME_QUESTION:
    state->handler = element7;
    return XML_ROLE_CONTENT_ELEMENT_OPT;
  case XML_TOK_NAME_ASTERISK:
    state->handler = element7;
    return XML_ROLE_CONTENT_ELEMENT_REP;
  case XML_TOK_NAME_PLUS:
    state->handler = element7;
    return XML_ROLE_CONTENT_ELEMENT_PLUS;
  }
  return common(state, tok);
}